

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

bool __thiscall QHttp2Connection::sendPing(QHttp2Connection *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView data;
  QRandomGenerator gen;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  memset(&gen,0xaa,0x9d0);
  QRandomGenerator::QRandomGenerator(&gen,1);
  std::generate<char*,QRandomGenerator::generate<char*>(char*,char*)::_lambda()_1_>
            ((char *)&local_30,(char *)&local_28,&gen);
  data.m_data = (storage_type *)&local_30;
  data.m_size = 8;
  bVar1 = sendPing(this,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendPing()
{
    std::array<char, 8> data;

    QRandomGenerator gen;
    gen.generate(data.begin(), data.end());
    return sendPing(data);
}